

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_File_Input.cxx
# Opt level: O0

int __thiscall Fl_File_Input::handle_button(Fl_File_Input *this,int event)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fl_When FVar4;
  Fl_Window *this_00;
  char *pcVar5;
  char local_838 [8];
  char newvalue [2048];
  char *end;
  char *start;
  int local_20;
  int X;
  int i;
  int event_local;
  Fl_File_Input *this_local;
  
  start._4_4_ = 0;
  for (local_20 = 0; this->buttons_[local_20] != 0; local_20 = local_20 + 1) {
    start._4_4_ = this->buttons_[local_20] + start._4_4_;
    iVar1 = Fl_Input_::xscroll((Fl_Input_ *)this);
    if (iVar1 < start._4_4_) {
      iVar1 = Fl::event_x();
      iVar2 = Fl_Widget::x((Fl_Widget *)this);
      iVar3 = Fl_Input_::xscroll((Fl_Input_ *)this);
      if (iVar1 < (iVar2 + start._4_4_) - iVar3) break;
    }
  }
  if (event == 2) {
    this->pressed_ = -1;
  }
  else {
    this->pressed_ = (short)local_20;
  }
  this_00 = Fl_Widget::window((Fl_Widget *)this);
  Fl_Window::make_current(this_00);
  draw_buttons(this);
  if ((this->buttons_[local_20] != 0) && (event == 2)) {
    pcVar5 = value(this);
    fl_strlcpy(local_838,pcVar5,0x800);
    end = local_838;
    while (newvalue._2040_8_ = end, end != (char *)0x0 && -1 < local_20) {
      pcVar5 = strchr(end,0x2f);
      if (pcVar5 == (char *)0x0) {
        newvalue[0x7f8] = '\0';
        newvalue[0x7f9] = '\0';
        newvalue[0x7fa] = '\0';
        newvalue[0x7fb] = '\0';
        newvalue[0x7fc] = '\0';
        newvalue[0x7fd] = '\0';
        newvalue[0x7fe] = '\0';
        newvalue[0x7ff] = '\0';
        break;
      }
      local_20 = local_20 + -1;
      end = pcVar5 + 1;
    }
    if (local_20 < 0) {
      *end = '\0';
      value(this,local_838,(int)end - (int)local_838);
      Fl_Widget::set_changed((Fl_Widget *)this);
      FVar4 = Fl_Widget::when((Fl_Widget *)this);
      if ((FVar4 & (FL_WHEN_RELEASE|FL_WHEN_CHANGED)) != FL_WHEN_NEVER) {
        Fl_Widget::do_callback((Fl_Widget *)this);
      }
    }
  }
  return 1;
}

Assistant:

int						// O - TRUE if we handled event
Fl_File_Input::handle_button(int event)		// I - Event
{
  int		i,				// Looping var
		X;				// Current X position
  char		*start,				// Start of path component
		*end;				// End of path component
  char		newvalue[FL_PATH_MAX];		// New value


  // Figure out which button is being pressed...
  for (X = 0, i = 0; buttons_[i]; i ++)
  {
    X += buttons_[i];

    if (X > xscroll() && Fl::event_x() < (x() + X - xscroll())) break;
  }

//  printf("handle_button(event = %d), button = %d\n", event, i);

  // Redraw the directory bar...
  if (event == FL_RELEASE) pressed_ = -1;
  else pressed_ = (short)i;

  window()->make_current();
  draw_buttons();

  // Return immediately if the user is clicking on the last button or
  // has not released the mouse button...
  if (!buttons_[i] || event != FL_RELEASE) return 1;

  // Figure out where to truncate the path...
  strlcpy(newvalue, value(), sizeof(newvalue));

  for (start = newvalue, end = start; start && i >= 0; start = end, i --) {
//    printf("    start = \"%s\"\n", start);
    if ((end = strchr(start, '/')) == NULL)
#if defined(WIN32) || defined(__EMX__)
      if ((end = strchr(start, '\\')) == NULL)
#endif // WIN32 || __EMX__
      break;

    end ++;
  }

  if (i < 0) {
    // Found the end; truncate the value and update the buttons...
    *start = '\0';
    value(newvalue, (int) (start - newvalue) );

    // Then do the callbacks, if necessary...
    set_changed();
    if (when() & (FL_WHEN_CHANGED|FL_WHEN_RELEASE) ) do_callback();
  }

  return 1;
}